

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void end_scope(LinearizerState *linearizer,Proc *proc,uint line_number)

{
  Scope *scope_00;
  uint *puVar1;
  Pseudo *pseudo;
  PtrListIterator symiter__;
  LuaSymbol *sym;
  Scope *scope;
  uint line_number_local;
  Proc *proc_local;
  LinearizerState *linearizer_local;
  
  scope_00 = proc->current_scope;
  if ((scope_00->field_0x18 & 1) != 0) {
    instruct_close(proc,proc->current_bb,scope_00,line_number);
  }
  raviX_ptrlist_reverse_iterator((PtrListIterator *)&pseudo,(PtrList *)scope_00->symbol_list);
  symiter__._16_8_ = raviX_ptrlist_iter_prev((PtrListIterator *)&pseudo);
  do {
    if (symiter__._16_8_ == 0) {
      proc->current_scope = scope_00->parent;
      return;
    }
    if (*(int *)symiter__._16_8_ == 0) {
      puVar1 = *(uint **)(symiter__._16_8_ + 0x38);
      if ((*puVar1 & 0xf) == 0) {
        if (((puVar1 == (uint *)0x0) || ((*puVar1 & 0xf) != 0)) ||
           (*(long *)(puVar1 + 2) != symiter__._16_8_)) {
          __assert_fail("pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd1,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        free_register(proc,&proc->local_pseudos,*puVar1 >> 4 & 0xffff);
      }
      else {
        if ((((*puVar1 & 0xf) != 2) && ((*puVar1 & 0xf) != 1)) && ((*puVar1 & 0xf) != 3)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd9,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        if (symiter__._16_8_ != *(long *)(puVar1 + 2)) {
          __assert_fail("sym == pseudo->temp_for_local",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd5,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        free_temp_pseudo(proc,*(Pseudo **)(symiter__._16_8_ + 0x38),true);
      }
    }
    symiter__._16_8_ = raviX_ptrlist_iter_prev((PtrListIterator *)&pseudo);
  } while( true );
}

Assistant:

static void end_scope(LinearizerState *linearizer, Proc *proc, unsigned line_number)
{
	Scope *scope = proc->current_scope;
	LuaSymbol *sym;
	if (scope->need_close) {
		instruct_close(proc, proc->current_bb, scope, line_number);
	}
	FOR_EACH_PTR_REVERSE(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			Pseudo *pseudo = sym->variable.pseudo;
			if (pseudo->type == PSEUDO_SYMBOL) {
				assert(pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym);
				free_register(proc, &proc->local_pseudos, pseudo->regnum);
			}
			else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_FLT || pseudo->type == PSEUDO_TEMP_BOOL) {
				assert(sym == pseudo->temp_for_local);
				free_temp_pseudo(proc, sym->variable.pseudo, true);
			}
			else {
				assert(false);
			}
		}
	}
	END_FOR_EACH_PTR_REVERSE(sym)
	proc->current_scope = scope->parent;
}